

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_printf_describe(roaring_bitmap_t *r)

{
  char cVar1;
  ushort uVar2;
  long lVar3;
  int32_t n_runs;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  run_container_t *run;
  char *pcVar7;
  long lVar8;
  
  putchar(0x7b);
  if (0 < (r->high_low_container).size) {
    lVar8 = 0;
    do {
      uVar5 = (uint)(r->high_low_container).typecodes[lVar8];
      if (3 < uVar5 - 1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x10e3,"const char *get_full_container_name(const container_t *, uint8_t)");
      }
      uVar2 = (r->high_low_container).keys[lVar8];
      run = (run_container_t *)(r->high_low_container).containers[lVar8];
      switch(uVar5) {
      case 1:
        pcVar7 = "bitset";
        break;
      case 2:
        pcVar7 = "array";
        break;
      case 3:
        pcVar7 = "run";
LAB_00113304:
        lVar3 = cpuid_Extended_Feature_Enumeration_info(7);
        if ((*(uint *)(lVar3 + 4) & 0x20) == 0) {
          uVar5 = run->n_runs;
          uVar4 = (ulong)(int)uVar5;
          if (0 < (long)uVar4) {
            uVar6 = 0;
            do {
              uVar5 = uVar5 + run->runs[uVar6].length;
              uVar6 = uVar6 + 1;
            } while (uVar4 != uVar6);
            uVar4 = (ulong)uVar5;
          }
        }
        else {
          uVar5 = _avx2_run_container_cardinality(run);
          uVar4 = (ulong)uVar5;
        }
        goto LAB_001132a0;
      case 4:
        cVar1 = *(char *)&run->runs;
        if (cVar1 == '\x03') {
          run = *(run_container_t **)run;
          pcVar7 = "run (shared)";
          goto LAB_00113304;
        }
        if (cVar1 == '\x02') {
          run = *(run_container_t **)run;
          pcVar7 = "array (shared)";
        }
        else {
          if (cVar1 != '\x01') {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x10dd,
                          "const char *get_full_container_name(const container_t *, uint8_t)");
          }
          run = *(run_container_t **)run;
          pcVar7 = "bitset (shared)";
        }
      }
      uVar4 = (ulong)(uint)run->n_runs;
LAB_001132a0:
      printf("%d: %s (%d)",(ulong)uVar2,pcVar7,uVar4);
      if ((r->high_low_container).typecodes[lVar8] == '\x04') {
        printf("(shared count = %u )");
      }
      lVar8 = lVar8 + 1;
      lVar3 = (long)(r->high_low_container).size;
      if (lVar8 < lVar3) {
        printf(", ");
        lVar3 = (long)(r->high_low_container).size;
      }
    } while (lVar8 < lVar3);
  }
  putchar(0x7d);
  return;
}

Assistant:

void roaring_bitmap_printf_describe(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    printf("{");
    for (int i = 0; i < ra->size; ++i) {
        printf("%d: %s (%d)", ra->keys[i],
               get_full_container_name(ra->containers[i], ra->typecodes[i]),
               container_get_cardinality(ra->containers[i], ra->typecodes[i]));

        if (ra->typecodes[i] == SHARED_CONTAINER_TYPE) {
            printf(
                "(shared count = %" PRIu32 " )",
                    CAST_shared(ra->containers[i])->counter);
        }

        if (i + 1 < ra->size) {
            printf(", ");
        }
    }
    printf("}");
}